

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void * RunTraditionalPQExperiment(void *threadarg)

{
  int insertedNum_1;
  int mode;
  int i_2;
  int i_1;
  int *a;
  int insertedNum;
  int i;
  uint64_t start;
  int operationsCount;
  uint seed;
  threadData *threadData;
  long in_stack_ffffffffffffff28;
  allocator<char> *numOfElement;
  Multiqueues<int> *this;
  int in_stack_ffffffffffffff3c;
  Multiqueues<int> *in_stack_ffffffffffffff40;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int local_98;
  allocator<char> local_91;
  string local_90 [36];
  int local_6c;
  undefined1 local_49 [33];
  int local_28;
  int local_24;
  undefined8 local_20;
  int local_18;
  uint local_14 [5];
  
  local_14[0] = 0;
  local_18 = (int)(10000000 / (long)threadsCount);
  local_20 = rdtsc();
  for (local_24 = 0; local_24 < local_18; local_24 = local_24 + 1) {
    local_28 = rand_r(local_14);
    local_28 = local_28 % 1000000;
    Multiqueues<int>::insertByThreadId(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  }
  this = (Multiqueues<int> *)local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
             ,in_stack_ffffffffffffff50);
  saveThroughput((string *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,(uint64_t)this,
                 in_stack_ffffffffffffff28);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  pthread_barrier_wait((pthread_barrier_t *)&barrier);
  local_18 = (int)(5000000 / (long)threadsCount);
  local_20 = rdtsc();
  for (local_6c = 0; local_6c < local_18; local_6c = local_6c + 1) {
    Multiqueues<int>::deleteMaxByThreadOwn(this);
  }
  numOfElement = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
             ,in_stack_ffffffffffffff50);
  saveThroughput((string *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,(uint64_t)this,
                 (long)numOfElement);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  pthread_barrier_wait((pthread_barrier_t *)&barrier);
  local_14[0] = 0;
  local_18 = (int)(4000000 / (long)threadsCount);
  local_20 = rdtsc();
  for (local_98 = 0; local_98 < local_18; local_98 = local_98 + 1) {
    in_stack_ffffffffffffff64 = rand_r(local_14);
    in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 % 3;
    if (in_stack_ffffffffffffff64 == 0) {
      Multiqueues<int>::deleteMaxByThreadOwn(this);
    }
    else {
      in_stack_ffffffffffffff60 = rand_r(local_14);
      in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 % 1000000;
      Multiqueues<int>::insertByThreadId(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
             ,in_stack_ffffffffffffff50);
  saveThroughput((string *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,(uint64_t)this,
                 (long)numOfElement);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
  return (void *)0x0;
}

Assistant:

void *RunTraditionalPQExperiment(void *threadarg) {
    struct threadData *threadData;
    threadData = (struct threadData *) threadarg;

    unsigned int seed = 0;
    int operationsCount = INSERT_ELEMENTS / threadsCount;

    uint64_t start = __rdtsc();
    for (int i = 0; i < operationsCount; ++i) {
        int insertedNum = rand_r(&seed) % MAX_INSERTED_NUM;
        priorityQueue->insertByThreadId(insertedNum);
    }
    saveThroughput("INSERT", threadData->threadId, start, operationsCount);

    pthread_barrier_wait(&barrier);
    int *a;
    operationsCount = DELETE_ELEMENTS / threadsCount;
    start = __rdtsc();
    for (int i = 0; i < operationsCount; ++i) {
        priorityQueue->deleteMaxByThreadOwn();
    }
    saveThroughput("DELETE", threadData->threadId, start, operationsCount);

    pthread_barrier_wait(&barrier);
    seed = 0;
    operationsCount = RANDOM_ELEMENTS / threadsCount;
    start = __rdtsc();
    for (int i = 0; i < operationsCount; ++i) {
        int mode = rand_r(&seed) % 3;
        if (mode == 0) {
            priorityQueue->deleteMaxByThreadOwn();
        } else {
            int insertedNum = rand_r(&seed) % MAX_INSERTED_NUM;
            priorityQueue->insertByThreadId(insertedNum);
        }
    }
    saveThroughput("RANDOM", threadData->threadId, start, operationsCount);

    return nullptr;
}